

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint __thiscall llvm::dwarf::getAttributeEncoding(dwarf *this,StringRef EncodingString)

{
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringLiteral S;
  StringLiteral S_00;
  StringLiteral S_01;
  StringLiteral S_02;
  StringLiteral S_03;
  StringLiteral S_04;
  StringLiteral S_05;
  StringLiteral S_06;
  StringLiteral S_07;
  StringLiteral S_08;
  StringLiteral S_09;
  StringLiteral S_10;
  StringLiteral S_11;
  StringLiteral S_12;
  StringLiteral S_13;
  StringLiteral S_14;
  StringLiteral S_15;
  StringLiteral S_16;
  StringSwitch<unsigned_int,_unsigned_int> local_40;
  
  local_40.Str.Length = (size_t)EncodingString.Data;
  local_40.Result.Storage.field_0.empty = '\0';
  local_40.Result.Storage.hasVal = false;
  S.super_StringRef.Length = 0xe;
  S.super_StringRef.Data = "DW_ATE_address";
  local_40.Str.Data = (char *)this;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_40,S,1);
  S_00.super_StringRef.Length = 0xe;
  S_00.super_StringRef.Data = "DW_ATE_boolean";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_00,2);
  S_01.super_StringRef.Length = 0x14;
  S_01.super_StringRef.Data = "DW_ATE_complex_float";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_01,3);
  S_02.super_StringRef.Length = 0xc;
  S_02.super_StringRef.Data = "DW_ATE_float";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_02,4);
  S_03.super_StringRef.Length = 0xd;
  S_03.super_StringRef.Data = "DW_ATE_signed";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_03,5);
  S_04.super_StringRef.Length = 0x12;
  S_04.super_StringRef.Data = "DW_ATE_signed_char";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_04,6);
  S_05.super_StringRef.Length = 0xf;
  S_05.super_StringRef.Data = "DW_ATE_unsigned";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_05,7);
  S_06.super_StringRef.Length = 0x14;
  S_06.super_StringRef.Data = "DW_ATE_unsigned_char";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_06,8);
  S_07.super_StringRef.Length = 0x16;
  S_07.super_StringRef.Data = "DW_ATE_imaginary_float";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_07,9);
  S_08.super_StringRef.Length = 0x15;
  S_08.super_StringRef.Data = "DW_ATE_packed_decimal";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_08,10);
  S_09.super_StringRef.Length = 0x15;
  S_09.super_StringRef.Data = "DW_ATE_numeric_string";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_09,0xb);
  S_10.super_StringRef.Length = 0xd;
  S_10.super_StringRef.Data = "DW_ATE_edited";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_10,0xc);
  S_11.super_StringRef.Length = 0x13;
  S_11.super_StringRef.Data = "DW_ATE_signed_fixed";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_11,0xd);
  S_12.super_StringRef.Length = 0x15;
  S_12.super_StringRef.Data = "DW_ATE_unsigned_fixed";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_12,0xe);
  S_13.super_StringRef.Length = 0x14;
  S_13.super_StringRef.Data = "DW_ATE_decimal_float";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_13,0xf);
  S_14.super_StringRef.Length = 10;
  S_14.super_StringRef.Data = "DW_ATE_UTF";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_14,0x10);
  S_15.super_StringRef.Length = 10;
  S_15.super_StringRef.Data = "DW_ATE_UCS";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_15,0x11);
  S_16.super_StringRef.Length = 0xc;
  S_16.super_StringRef.Data = "DW_ATE_ASCII";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_16,0x12);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getAttributeEncoding(StringRef EncodingString) {
  return StringSwitch<unsigned>(EncodingString)
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  .Case("DW_ATE_" #NAME, DW_ATE_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}